

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

raw_problem * baryonyx::make_problem(raw_problem *__return_storage_ptr__,context *ctx,istream *is)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  pointer pcVar7;
  pointer pvVar8;
  context *ctx_00;
  long lVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  string_view sVar19;
  raw_problem_status rVar20;
  stream_buffer sb;
  undefined1 local_1618 [56];
  pointer poStack_15e0;
  double local_15d8;
  undefined1 local_15d0 [16];
  pointer pcStack_15c0;
  pointer pcStack_15b8;
  pointer pcStack_15b0;
  pointer pcStack_15a8;
  undefined1 auStack_15a0 [16];
  pointer local_1590;
  undefined1 local_1588 [16];
  pointer pbStack_1578;
  pointer pcStack_1570;
  pointer pcStack_1568;
  pointer local_1560;
  int local_1558;
  int iStack_1554;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1550;
  stream_buffer local_1518;
  undefined1 auVar13 [64];
  
  ctx_00 = (context *)local_1618;
  memset(&local_1518,0,0x14f0);
  lVar9 = 8;
  local_1518.current_token_buffer = 0;
  local_1518.is = is;
  do {
    sVar19 = stream_buffer::next_token(&local_1518);
    *(size_t *)((long)local_1518.buffer_ptr._M_elems + lVar9 + -8) = sVar19._M_len;
    *(char **)((long)&local_1518.buffer_ptr._M_elems[0]._M_len + lVar9) = sVar19._M_str;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0xa8);
  problem_parser::problem_parser((problem_parser *)local_1618);
  rVar20 = parse(ctx_00,&local_1518,(problem_parser *)local_1618);
  pvVar8 = local_1560;
  pcVar7 = local_1590;
  if (rVar20.tag == success) {
    auVar10._32_8_ = local_1618._32_8_;
    auVar10._0_32_ = local_1618._0_32_;
    auVar10._40_16_ = local_1618._40_16_;
    auVar10._56_8_ = poStack_15e0;
    auVar10 = vmovdqu64_avx512f(auVar10);
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x9080403020100));
    local_1618._0_32_ = ZEXT1232(ZEXT812(0));
    auVar17 = ZEXT416(0) << 0x20;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_1618._32_8_;
    auVar12 = vpbroadcastq_avx512f(auVar1);
    auVar13._0_32_ = auVar10._0_32_;
    auVar13._32_8_ = auVar12._32_8_;
    auVar13._40_8_ = auVar10._40_8_;
    auVar13._48_8_ = auVar10._48_8_;
    auVar13._56_8_ = auVar10._56_8_;
    local_1618._32_8_ = (pointer)0x0;
    auVar12._16_8_ = poStack_15e0;
    auVar12._0_16_ = local_1618._40_16_;
    auVar12._24_8_ = local_15d8;
    auVar12._32_16_ = local_15d0;
    auVar12._48_8_ = pcStack_15c0;
    auVar12._56_8_ = pcStack_15b8;
    auVar10 = vpermi2q_avx512f(auVar11,auVar13,auVar12);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = poStack_15e0;
    auVar12 = vpbroadcastq_avx512f(auVar2);
    auVar14._56_8_ = auVar12._56_8_;
    auVar14._0_56_ = auVar10._0_56_;
    poStack_15e0 = (pointer)0x0;
    auVar11._16_8_ = pcStack_15c0;
    auVar11._0_16_ = local_15d0;
    auVar11._24_8_ = pcStack_15b8;
    auVar11._32_8_ = pcStack_15b0;
    auVar11._40_8_ = pcStack_15a8;
    auVar11._48_16_ = auStack_15a0;
    auVar12 = vmovdqu64_avx512f(auVar11);
    auVar10 = vmovdqu64_avx512f(auVar14);
    __return_storage_ptr__->strings = (string_buffer_ptr)auVar10._0_16_;
    (__return_storage_ptr__->objective).elements =
         (vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
          )auVar10._16_24_;
    (__return_storage_ptr__->objective).qelements =
         (vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
          )auVar10._40_24_;
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0x908020100));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pcStack_15c0;
    auVar11 = vpbroadcastq_avx512f(auVar3);
    auVar15._0_16_ = auVar12._0_16_;
    auVar15._16_8_ = auVar11._16_8_;
    auVar15._24_8_ = auVar12._24_8_;
    auVar15._32_8_ = auVar12._32_8_;
    auVar15._40_8_ = auVar12._40_8_;
    auVar15._48_8_ = auVar12._48_8_;
    auVar15._56_8_ = auVar12._56_8_;
    pcStack_15c0 = (pointer)0x0;
    (__return_storage_ptr__->objective).value = local_15d8;
    auVar6._8_8_ = pcStack_15b0;
    auVar6._0_8_ = pcStack_15b8;
    auVar6._16_8_ = pcStack_15a8;
    auVar6._24_16_ = auStack_15a0;
    auVar6._40_8_ = local_1590;
    auVar6._48_16_ = local_1588;
    auVar10 = vpermi2q_avx512f(auVar10,auVar15,auVar6);
    pcStack_15b8 = (pointer)0x0;
    pcStack_15b0 = (pointer)0x0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = pcStack_15a8;
    auVar12 = vpbroadcastq_avx512f(auVar4);
    auVar16._0_40_ = auVar10._0_40_;
    auVar16._40_8_ = auVar12._40_8_;
    auVar16._48_8_ = auVar10._48_8_;
    auVar16._56_8_ = auVar10._56_8_;
    pcStack_15a8 = (pointer)0x0;
    auVar10 = vinserti32x4_avx512f(auVar16,auStack_15a0,3);
    auVar10 = vmovdqu64_avx512f(auVar10);
    __return_storage_ptr__->equal_constraints =
         (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>)auVar10._0_24_;
    __return_storage_ptr__->greater_constraints =
         (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>)auVar10._24_24_;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)auVar10._48_8_;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)auVar10._56_8_;
    local_1590 = (pointer)0x0;
    auVar5._16_8_ = pbStack_1578;
    auVar5._0_16_ = local_1588;
    auVar5._24_8_ = pcStack_1570;
    auVar5 = vpermpd_avx2(auVar5,0xd0);
    auVar5 = vblendps_avx(auVar5,ZEXT832(pcVar7),3);
    auVar18._8_8_ = pbStack_1578;
    auVar18._0_8_ = pbStack_1578;
    auVar18._16_8_ = pbStack_1578;
    auVar18._24_8_ = pbStack_1578;
    pbStack_1578 = (pointer)0x0;
    local_1560 = (pointer)0x0;
    auVar5 = vblendps_avx(auVar5,auVar18,0xc0);
    *(undefined1 (*) [32])
     &(__return_storage_ptr__->less_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = auVar5;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pcStack_1570;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pcStack_1568;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pvVar8;
    __return_storage_ptr__->type = local_1558;
    __return_storage_ptr__->status = iStack_1554;
    local_1618._40_16_ = auVar17;
    local_15d0 = auVar17;
    auStack_15a0 = auVar17;
    local_1588 = auVar17;
    pcStack_1570 = pcStack_15b8;
    pcStack_1568 = pcStack_15b0;
  }
  else {
    __return_storage_ptr__->type = maximize;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).value = 0.0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->status = rVar20.tag;
  }
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1550);
  raw_problem::~raw_problem((raw_problem *)local_1618);
  return __return_storage_ptr__;
}

Assistant:

raw_problem
make_problem(const context& ctx, std::istream& is) noexcept
{
    stream_buffer sb(is);
    problem_parser p;

    if (auto ret = parse(ctx, sb, p); ret)
        return std::move(p.m_problem);
    else
        return raw_problem(ret.tag);
}